

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O3

int Gia_IffObjCount(Gia_Man_t *pGia,int iObj,int iFaninSkip2,int iFaninSkip3)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  Gia_ManIncrementTravId(pGia);
  if (-1 < iObj) {
    pVVar2 = pGia->vMapping;
    uVar5 = pVVar2->nSize;
    if (iObj < (int)uVar5) {
      piVar3 = pVVar2->pArray;
      iVar4 = 0;
      lVar6 = 0;
      do {
        lVar7 = (long)piVar3[(uint)iObj];
        if ((lVar7 < 0) || (uVar5 <= (uint)piVar3[(uint)iObj])) break;
        if (piVar3[lVar7] <= lVar6) {
          if (iFaninSkip2 < 0) goto LAB_006f9e1a;
          if (iFaninSkip2 < (int)uVar5) {
            lVar6 = 0;
            goto LAB_006f9dbb;
          }
          break;
        }
        iVar1 = piVar3[lVar7 + lVar6 + 1];
        if (iVar1 != iFaninSkip3 && iVar1 != iFaninSkip2) {
          if (pGia->nTravIdsAlloc <= iVar1) goto LAB_006f9ea3;
          if (pGia->pTravIds[iVar1] != pGia->nTravIds) {
            pGia->pTravIds[iVar1] = pGia->nTravIds;
            iVar4 = iVar4 + 1;
          }
        }
        lVar6 = lVar6 + 1;
        uVar5 = pVVar2->nSize;
      } while (iObj < (int)uVar5);
    }
  }
  goto LAB_006f9e79;
  while( true ) {
    if (piVar3[lVar7] <= lVar6) goto LAB_006f9e1a;
    iVar1 = piVar3[lVar7 + lVar6 + 1];
    if (iVar1 != iFaninSkip3) {
      if (pGia->nTravIdsAlloc <= iVar1) goto LAB_006f9ea3;
      if (pGia->pTravIds[iVar1] != pGia->nTravIds) {
        pGia->pTravIds[iVar1] = pGia->nTravIds;
        iVar4 = iVar4 + 1;
        uVar5 = pVVar2->nSize;
      }
    }
    lVar6 = lVar6 + 1;
    if ((int)uVar5 <= iFaninSkip2) break;
LAB_006f9dbb:
    lVar7 = (long)piVar3[(uint)iFaninSkip2];
    if ((lVar7 < 0) || (uVar5 <= (uint)piVar3[(uint)iFaninSkip2])) break;
  }
  goto LAB_006f9e79;
LAB_006f9e1a:
  if (iFaninSkip3 < 0) {
    return iVar4;
  }
  if (iFaninSkip3 < (int)uVar5) {
    lVar6 = 0;
    do {
      lVar7 = (long)piVar3[(uint)iFaninSkip3];
      if ((lVar7 < 0) || (uVar5 <= (uint)piVar3[(uint)iFaninSkip3])) break;
      if (piVar3[lVar7] <= lVar6) {
        return iVar4;
      }
      iVar1 = piVar3[lVar7 + lVar6 + 1];
      if (iVar1 != iFaninSkip2) {
        if (pGia->nTravIdsAlloc <= iVar1) {
LAB_006f9ea3:
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x23f,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
        }
        if (pGia->pTravIds[iVar1] != pGia->nTravIds) {
          pGia->pTravIds[iVar1] = pGia->nTravIds;
          iVar4 = iVar4 + 1;
          uVar5 = pVVar2->nSize;
        }
      }
      lVar6 = lVar6 + 1;
    } while (iFaninSkip3 < (int)uVar5);
  }
LAB_006f9e79:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_IffObjCount( Gia_Man_t * pGia, int iObj, int iFaninSkip2, int iFaninSkip3 )
{
    int i, iFanin, Count = 0;
    Gia_ManIncrementTravId( pGia );
    Gia_LutForEachFanin( pGia, iObj, iFanin, i )
    {
        if ( iFanin == iFaninSkip2 || iFanin == iFaninSkip3 )
            continue;
        if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
            continue;
        Gia_ObjSetTravIdCurrentId( pGia, iFanin );
        Count++;
    }
    if ( iFaninSkip2 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip2, iFanin, i )
        {
            if ( iFanin == iFaninSkip3 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    if ( iFaninSkip3 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip3, iFanin, i )
        {
            if ( iFanin == iFaninSkip2 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    return Count;
}